

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O2

void __thiscall Assimp::DefaultLogger::OnDebug(DefaultLogger *this,char *message)

{
  char msg [1040];
  
  if ((this->super_Logger).m_Severity != NORMAL) {
    snprintf(msg,0x410,"Debug, T%u: %s",0,message);
    WriteToStreams(this,msg,Debugging);
  }
  return;
}

Assistant:

void DefaultLogger::OnDebug( const char* message ) {
    if ( m_Severity == Logger::NORMAL ) {
        return;
    }

	static const size_t Size = MAX_LOG_MESSAGE_LENGTH + 16;
	char msg[Size];
	ai_snprintf(msg, Size, "Debug, T%u: %s", GetThreadID(), message);

    WriteToStreams( msg, Logger::Debugging );
}